

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_bfba::TextureWriterTestHelper<unsigned_char,_4U,_32856U>::TextureWriterTestHelper
          (TextureWriterTestHelper<unsigned_char,_4U,_32856U> *this)

{
  char *pcVar1;
  size_type __dnew;
  size_type local_20;
  
  (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).writer_ktx2._M_dataplus._M_p =
       (pointer)&(this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).writer_ktx2.field_2;
  local_20 = 0x1f;
  pcVar1 = (char *)std::__cxx11::string::_M_create
                             ((ulong *)&(this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).
                                        writer_ktx2,(ulong)&local_20);
  (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).writer_ktx2._M_dataplus._M_p = pcVar1;
  (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).writer_ktx2.field_2.
  _M_allocated_capacity = local_20;
  builtin_strncpy(pcVar1,"WriteTestHelper 1.0 __default__",0x1f);
  (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).writer_ktx2._M_string_length = local_20;
  (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).writer_ktx2._M_dataplus._M_p[local_20] =
       '\0';
  (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).comparisonWriter_ktx2._M_dataplus._M_p =
       (pointer)&(this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).comparisonWriter_ktx2.
                 field_2;
  (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).comparisonWriter_ktx2._M_string_length =
       0;
  (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).comparisonWriter_ktx2.field_2.
  _M_local_buf[0] = '\0';
  (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).images.
  super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).images.
  super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).images.
  super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).imageList.
  super__Vector_base<wthImageInfo,_std::allocator<wthImageInfo>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).imageList.
  super__Vector_base<wthImageInfo,_std::allocator<wthImageInfo>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).imageList.
  super__Vector_base<wthImageInfo,_std::allocator<wthImageInfo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).texinfo.super_wthTexInfo.
  super_ktxTextureCreateInfo.glInternalformat = 0x8058;
  (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).texinfo.super_wthTexInfo.glTypeSize = 1;
  (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).texinfo.super_wthTexInfo.glType = 0x1401
  ;
  (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).texinfo.super_wthTexInfo.glFormat =
       0x1908;
  (this->super_WriterTestHelper<unsigned_char,_4U,_32856U>).texinfo.super_wthTexInfo.
  glBaseInternalformat = 0x1908;
  (this->createInfo).super_ktxTextureCreateInfo.glInternalformat = 0x8058;
  return;
}

Assistant:

TextureWriterTestHelper() {}